

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O1

void __thiscall
QMessageBoxPrivate::setClickedButton(QMessageBoxPrivate *this,QAbstractButton *button)

{
  QObject *pQVar1;
  int iVar2;
  long in_FS_OFFSET;
  QAbstractButton *local_40;
  void *local_38;
  QAbstractButton **ppQStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QObject **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  this->clickedButton = button;
  ppQStack_30 = &local_40;
  local_38 = (void *)0x0;
  local_40 = button;
  QMetaObject::activate(pQVar1,&QMessageBox::staticMetaObject,0,&local_38);
  iVar2 = execReturnCode(this,button);
  (**(code **)(*(long *)pQVar1 + 0x1b0))(pQVar1,iVar2);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMessageBoxPrivate::setClickedButton(QAbstractButton *button)
{
    Q_Q(QMessageBox);

    clickedButton = button;
    emit q->buttonClicked(clickedButton);

    auto resultCode = execReturnCode(button);
    q->done(resultCode);
}